

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassVariable.cpp
# Opt level: O3

void __thiscall hdc::ClassVariable::ClassVariable(ClassVariable *this,Token *token)

{
  int iVar1;
  
  ASTNode::ASTNode((ASTNode *)this);
  (this->super_Variable).token.lexem._M_dataplus._M_p =
       (pointer)&(this->super_Variable).token.lexem.field_2;
  (this->super_Variable).token.lexem._M_string_length = 0;
  (this->super_Variable).token.lexem.field_2._M_local_buf[0] = '\0';
  (this->super_Variable).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00198168;
  iVar1 = token->line;
  (this->super_Variable).token.kind = token->kind;
  (this->super_Variable).token.line = iVar1;
  (this->super_Variable).token.column = token->column;
  std::__cxx11::string::_M_assign((string *)&(this->super_Variable).token.lexem);
  (this->super_Variable).type = (Type *)0x0;
  ASTNode::setKind((ASTNode *)this,AST_CLASS_VARIABLE);
  return;
}

Assistant:

ClassVariable::ClassVariable(Token& token) {
    this->token = token;
    this->type = nullptr;
    setKind(AST_CLASS_VARIABLE);
}